

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_nav2D.cpp
# Opt level: O1

void __thiscall EnvironmentNAV2D::PrintTimeStat(EnvironmentNAV2D *this,FILE *fOut)

{
  return;
}

Assistant:

void EnvironmentNAV2D::PrintTimeStat(FILE* fOut)
{
#if TIME_DEBUG
    SBPL_FPRINTF(fOut,
                "time3_addallout = %f secs, time_gethash = %f secs, time_createhash = %f secs, time_getsuccs = %f\n",
                time3_addallout/(double)CLOCKS_PER_SEC, time_gethash/(double)CLOCKS_PER_SEC,
                time_createhash/(double)CLOCKS_PER_SEC, time_getsuccs/(double)CLOCKS_PER_SEC);
#endif
}